

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O3

void __thiscall json11::Json::Json(Json *this,array *values)

{
  pointer pJVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001afcf8;
  pJVar1 = (values->super__Vector_base<json11::Json,_std::allocator<json11::Json>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  *(pointer *)&p_Var2[1]._M_use_count =
       (values->super__Vector_base<json11::Json,_std::allocator<json11::Json>_>)._M_impl.
       super__Vector_impl_data._M_start;
  p_Var2[2]._vptr__Sp_counted_base = (_func_int **)pJVar1;
  *(pointer *)&p_Var2[2]._M_use_count =
       (values->super__Vector_base<json11::Json,_std::allocator<json11::Json>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (values->super__Vector_base<json11::Json,_std::allocator<json11::Json>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (values->super__Vector_base<json11::Json,_std::allocator<json11::Json>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (values->super__Vector_base<json11::Json,_std::allocator<json11::Json>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR_type_001af4f0;
  (this->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var2 + 1);
  (this->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var2;
  return;
}

Assistant:

Json::Json(Json::array &&values)       : m_ptr(make_shared<JsonArray>(move(values))) {}